

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ScaleLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_scale(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0xf5) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xf5;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.scale_ = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::ScaleLayerParams>(arena);
    (this->layer_).scale_ = (ScaleLayerParams *)LVar2;
  }
  return (ScaleLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ScaleLayerParams* NeuralNetworkLayer::_internal_mutable_scale() {
  if (!_internal_has_scale()) {
    clear_layer();
    set_has_scale();
    layer_.scale_ = CreateMaybeMessage< ::CoreML::Specification::ScaleLayerParams >(GetArenaForAllocation());
  }
  return layer_.scale_;
}